

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O0

bool TPZChangeEl::NearestNode(TPZGeoEl *gel,TPZVec<double> *x,int64_t *meshNode,double tol)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  undefined8 uVar4;
  undefined8 *in_RDX;
  TPZVec<double> *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  int c;
  double dist;
  int n;
  int nnodes;
  TPZVec<double> nodeCoord;
  bool IsNearSomeNode;
  int64_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  TPZVec<double> *in_stack_ffffffffffffff48;
  TPZGeoEl *in_stack_ffffffffffffff50;
  int local_6c;
  double local_68;
  int local_60;
  TPZVec<double> local_48;
  byte local_21;
  double local_20;
  undefined8 *local_18;
  TPZVec<double> *local_10;
  long *local_8;
  
  *in_RDX = 0xffffffffffffffff;
  local_21 = 0;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TPZVec<double>::TPZVec
            ((TPZVec<double> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  iVar2 = (**(code **)(*local_8 + 0x90))();
  local_60 = 0;
  do {
    if (iVar2 <= local_60) {
LAB_01803dc6:
      TPZVec<double>::~TPZVec((TPZVec<double> *)CONCAT17(local_21,in_stack_ffffffffffffff40));
      return (bool)(local_21 & 1);
    }
    local_68 = 0.0;
    TPZGeoEl::NodePtr(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    TPZGeoNode::GetCoordinates((TPZGeoNode *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      pdVar3 = TPZVec<double>::operator[](local_10,(long)local_6c);
      dVar5 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_48,(long)local_6c);
      dVar1 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](local_10,(long)local_6c);
      in_stack_ffffffffffffff50 = (TPZGeoEl *)*pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_48,(long)local_6c);
      local_68 = (dVar5 - dVar1) * ((double)in_stack_ffffffffffffff50 - *pdVar3) + local_68;
    }
    dVar5 = sqrt(local_68);
    if (dVar5 <= local_20) {
      uVar4 = (**(code **)(*local_8 + 0xa8))(local_8,local_60);
      *local_18 = uVar4;
      local_21 = 1;
      goto LAB_01803dc6;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

bool TPZChangeEl::NearestNode(TPZGeoEl * gel, TPZVec<REAL> &x, int64_t &meshNode, double tol)
{    
	meshNode = -1;
	bool IsNearSomeNode = false;
	
	TPZVec<REAL> nodeCoord(3);
	int nnodes = gel->NNodes();
	
	for(int n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gel->NodePtr(n)->GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = gel->NodeIndex(n);
			IsNearSomeNode = true;
			break;
		}
	}
	
	return IsNearSomeNode;
}